

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBvhTriangleMeshShape.cpp
# Opt level: O3

void __thiscall
cbtBvhTriangleMeshShape::processAllTriangles::MyNodeOverlapCallback::processNode
          (MyNodeOverlapCallback *this,int nodeSubPart,int nodeTriangleIndex)

{
  float fVar1;
  undefined8 uVar2;
  cbtStridingMeshInterface *pcVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  int iVar6;
  uint uVar7;
  cbtScalar *pcVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  float fVar12;
  PHY_ScalarType indicestype;
  ulong local_60;
  uchar *vertexbase;
  int numfaces;
  int indexstride;
  int stride;
  PHY_ScalarType type;
  int numverts;
  uchar *indexbase;
  
  this->m_numOverlap = this->m_numOverlap + 1;
  local_60 = (ulong)(uint)nodeSubPart;
  (*this->m_meshInterface->_vptr_cbtStridingMeshInterface[4])
            (this->m_meshInterface,&vertexbase,&numverts,&type,&stride,&indexbase,&indexstride,
             &numfaces,&indicestype,local_60);
  uVar5 = local_60;
  pcVar3 = this->m_meshInterface;
  pcVar8 = this->m_triangle[2].m_floats + 3;
  lVar9 = 0;
  iVar6 = indexstride * nodeTriangleIndex;
  do {
    if (indicestype == PHY_INTEGER) {
      uVar7 = *(uint *)(indexbase + lVar9 * 4 + (long)iVar6 + 8);
    }
    else if (indicestype == PHY_SHORT) {
      uVar7 = (uint)*(ushort *)(indexbase + lVar9 * 2 + (long)iVar6 + 4);
    }
    else {
      uVar7 = (uint)indexbase[lVar9 + (long)iVar6 + 2];
    }
    lVar10 = (long)(int)uVar7 * (long)stride;
    if (type == PHY_FLOAT) {
      uVar2 = *(undefined8 *)(pcVar3->m_scaling).m_floats;
      auVar11._0_4_ = (float)*(undefined8 *)(vertexbase + lVar10) * (float)uVar2;
      auVar11._4_4_ =
           (float)((ulong)*(undefined8 *)(vertexbase + lVar10) >> 0x20) *
           (float)((ulong)uVar2 >> 0x20);
      auVar11._8_8_ = 0;
      fVar12 = *(float *)(vertexbase + lVar10 + 8);
    }
    else {
      auVar4 = vcvtpd2ps_avx(*(undefined1 (*) [16])(vertexbase + lVar10));
      uVar2 = *(undefined8 *)(pcVar3->m_scaling).m_floats;
      auVar11._0_4_ = (float)uVar2 * auVar4._0_4_;
      auVar11._4_4_ = (float)((ulong)uVar2 >> 0x20) * auVar4._4_4_;
      auVar11._8_4_ = auVar4._8_4_ * 0.0;
      auVar11._12_4_ = auVar4._12_4_ * 0.0;
      fVar12 = (float)*(double *)(vertexbase + lVar10 + 0x10);
    }
    fVar1 = (pcVar3->m_scaling).m_floats[2];
    uVar2 = vmovlps_avx(auVar11);
    *(undefined8 *)((cbtVector3 *)(pcVar8 + -3))->m_floats = uVar2;
    lVar9 = lVar9 + -1;
    pcVar8[-1] = fVar12 * fVar1;
    *pcVar8 = 0.0;
    pcVar8 = pcVar8 + -4;
  } while (lVar9 != -3);
  (*this->m_callback->_vptr_cbtTriangleCallback[2])
            (this->m_callback,this->m_triangle,local_60 & 0xffffffff,(ulong)(uint)nodeTriangleIndex)
  ;
  (*this->m_meshInterface->_vptr_cbtStridingMeshInterface[6])
            (this->m_meshInterface,uVar5 & 0xffffffff);
  return;
}

Assistant:

virtual void processNode(int nodeSubPart, int nodeTriangleIndex)
		{
			m_numOverlap++;
			const unsigned char* vertexbase;
			int numverts;
			PHY_ScalarType type;
			int stride;
			const unsigned char* indexbase;
			int indexstride;
			int numfaces;
			PHY_ScalarType indicestype;

			m_meshInterface->getLockedReadOnlyVertexIndexBase(
				&vertexbase,
				numverts,
				type,
				stride,
				&indexbase,
				indexstride,
				numfaces,
				indicestype,
				nodeSubPart);

			unsigned int* gfxbase = (unsigned int*)(indexbase + nodeTriangleIndex * indexstride);
			cbtAssert(indicestype == PHY_INTEGER || indicestype == PHY_SHORT || indicestype == PHY_UCHAR);

			const cbtVector3& meshScaling = m_meshInterface->getScaling();
			for (int j = 2; j >= 0; j--)
			{
				int graphicsindex = indicestype == PHY_SHORT ? ((unsigned short*)gfxbase)[j] : indicestype == PHY_INTEGER ? gfxbase[j] : ((unsigned char*)gfxbase)[j];

#ifdef DEBUG_TRIANGLE_MESH
				printf("%d ,", graphicsindex);
#endif  //DEBUG_TRIANGLE_MESH
				if (type == PHY_FLOAT)
				{
					float* graphicsbase = (float*)(vertexbase + graphicsindex * stride);

					m_triangle[j] = cbtVector3(
						graphicsbase[0] * meshScaling.getX(),
						graphicsbase[1] * meshScaling.getY(),
						graphicsbase[2] * meshScaling.getZ());
				}
				else
				{
					double* graphicsbase = (double*)(vertexbase + graphicsindex * stride);

					m_triangle[j] = cbtVector3(
						cbtScalar(graphicsbase[0]) * meshScaling.getX(),
						cbtScalar(graphicsbase[1]) * meshScaling.getY(),
						cbtScalar(graphicsbase[2]) * meshScaling.getZ());
				}
#ifdef DEBUG_TRIANGLE_MESH
				printf("triangle vertices:%f,%f,%f\n", triangle[j].x(), triangle[j].y(), triangle[j].z());
#endif  //DEBUG_TRIANGLE_MESH
			}

			m_callback->processTriangle(m_triangle, nodeSubPart, nodeTriangleIndex);
			m_meshInterface->unLockReadOnlyVertexBase(nodeSubPart);
		}